

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
::Iterator<Kernel::Literal*,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
          (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed,AbstractingUnifier *args,
          AbstractionOracle args_1,bool args_2)

{
  byte bVar1;
  byte bVar2;
  undefined8 in_RCX;
  byte bVar3;
  AbstractingUnifier *in_RSI;
  UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  *in_RDI;
  byte in_R8B;
  byte in_R9B;
  undefined4 in_stack_00000010;
  byte in_stack_00000018;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  Stack<Lib::BacktrackData> *in_stack_ffffffffffffff70;
  bool *query_00;
  undefined4 in_stack_ffffffffffffffbc;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_stack_ffffffffffffffc0;
  undefined5 in_stack_ffffffffffffffc8;
  AbstractionOracle args_1_00;
  
  args_1_00._mode = (UnificationWithAbstraction)((ulong)in_RCX >> 0x20);
  bVar3 = in_R8B & 1;
  bVar2 = in_R9B & 1;
  bVar1 = in_stack_00000018 & 1;
  RetrievalAlgorithms::
  UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  ::UnificationWithAbstraction(in_RDI);
  Lib::Stack<unsigned_int>::Stack
            ((Stack<unsigned_int> *)in_stack_ffffffffffffff70,
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  query_00 = &in_RDI[3]._fixedPointIteration;
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_> *)
             0x44072f);
  Lib::
  Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>
  ::Stack((Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>
           *)in_stack_ffffffffffffff70,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
         );
  Lib::BacktrackData::BacktrackData((BacktrackData *)&in_RDI[6]._fixedPointIteration);
  Lib::Stack<Lib::BacktrackData>::Stack
            (in_stack_ffffffffffffff70,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
            );
  Lib::BacktrackData::BacktrackData((BacktrackData *)&in_RDI[9]._fixedPointIteration);
  InstanceCntr::InstanceCntr((InstanceCntr *)(in_RDI + 10));
  init<Kernel::Literal*,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
            ((Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
              *)CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(bVar1,in_stack_ffffffffffffffc8))),
             in_stack_ffffffffffffffc0,(Node *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_00000010)
             ,(Literal *)query_00,SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0),
             in_RSI,args_1_00,SUB81((ulong)in_RDI >> 0x28,0));
  return;
}

Assistant:

Iterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args)
       : _algo()
      { init(parent, root, query, retrieveSubstitution, reversed, std::move(args)...); }